

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

Promise<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_> __thiscall
kj::(anonymous_namespace)::AsyncStreamFd::tryReceiveFdImpl<kj::Own<kj::AsyncCapabilityStream>>
          (AsyncStreamFd *this)

{
  UnixEventPort *eventPort;
  PromiseBase PVar1;
  PromiseNode *pPVar2;
  int iVar3;
  ssize_t sVar4;
  TransformPromiseNodeBase *this_00;
  undefined4 extraout_var;
  AsyncStreamFd *this_01;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ChainPromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  ChainPromiseNode *extraout_RDX_01;
  _func_int **in_RSI;
  AsyncCapabilityStream *pAVar5;
  Own<kj::_::ChainPromiseNode> OVar6;
  Own<kj::_::ImmediatePromiseNode<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_>_> OVar7;
  char c;
  Fault f;
  Fault f_1;
  anon_union_24_2_c6a5a82d anon_var_2;
  msghdr msg;
  undefined1 local_d9;
  Own<kj::_::PromiseNode> local_d8;
  Fault local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [8];
  AsyncCapabilityStream *local_b0;
  Maybe<kj::Own<kj::AsyncCapabilityStream>_> local_a8;
  Maybe<kj::Own<kj::AsyncCapabilityStream>_> local_90;
  PromiseFulfiller<void> *local_80;
  int local_78;
  int local_74;
  int local_70;
  iovec local_68;
  msghdr local_58;
  
  local_58.msg_name = (void *)0x0;
  local_58.msg_namelen = 0;
  local_58._12_4_ = 0;
  local_58.msg_flags = 0;
  local_58._52_4_ = 0;
  local_68.iov_base = &local_d9;
  local_58.msg_iov = &local_68;
  local_68.iov_len = 1;
  local_58.msg_iovlen = 1;
  local_58.msg_control = &local_80;
  local_58.msg_controllen = 0x18;
  do {
    sVar4 = recvmsg(*(int *)(in_RSI + 2),&local_58,0x40000000);
    if (-1 < sVar4) {
      if (sVar4 != 0) {
        if (local_58.msg_controllen < 0x10) {
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[58]>
                    (&local_c8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                     ,0x1da,FAILED,"msg.msg_controllen >= sizeof(cmsg)",
                     "\"expected to receive FD over socket; received data instead\"",
                     (char (*) [58])"expected to receive FD over socket; received data instead");
          _::Debug::Fault::fatal(&local_c8);
        }
        if (local_78 != 1) {
          local_d8.disposer = (Disposer *)0x0;
          local_c8.exception = (Exception *)0x0;
          uStack_c0 = 0;
          _::Debug::Fault::init
                    ((Fault *)&local_d8,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                    );
          _::Debug::Fault::fatal((Fault *)&local_d8);
        }
        if (local_74 != 1) {
          local_d8.disposer = (Disposer *)0x0;
          local_c8.exception = (Exception *)0x0;
          uStack_c0 = 0;
          _::Debug::Fault::init
                    ((Fault *)&local_d8,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                    );
          _::Debug::Fault::fatal((Fault *)&local_d8);
        }
        if (local_80 == (PromiseFulfiller<void> *)0x14) {
          eventPort = (UnixEventPort *)in_RSI[3];
          this_01 = (AsyncStreamFd *)operator_new(0x90);
          anon_unknown_30::AsyncStreamFd::AsyncStreamFd(this_01,eventPort,local_70,3);
          local_90.ptr.disposer =
               (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::AsyncStreamFd>::instance;
          local_90.ptr.ptr = (AsyncCapabilityStream *)this_01;
          OVar7 = heap<kj::_::ImmediatePromiseNode<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>>>,kj::Maybe<kj::Own<kj::AsyncCapabilityStream>>>
                            ((kj *)&local_c8,&local_90);
          pAVar5 = local_90.ptr.ptr;
          *(undefined4 *)this = local_c8.exception._0_4_;
          *(undefined4 *)(this + 4) = local_c8.exception._4_4_;
          *(undefined4 *)(this + 8) = (undefined4)uStack_c0;
          *(undefined4 *)(this + 0xc) = uStack_c0._4_4_;
          if ((AsyncStreamFd *)local_90.ptr.ptr == (AsyncStreamFd *)0x0) {
            return (Promise<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_>)OVar7;
          }
          local_90.ptr.ptr = (AsyncCapabilityStream *)0x0;
          iVar3 = (**(local_90.ptr.disposer)->_vptr_Disposer)
                            (local_90.ptr.disposer,
                             (((AsyncCapabilityStream *)&pAVar5->super_AsyncIoStream)->
                             super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream[-2]
                             + (long)&(((AsyncCapabilityStream *)&pAVar5->super_AsyncIoStream)->
                                      super_AsyncIoStream).super_AsyncInputStream.
                                      _vptr_AsyncInputStream);
          PVar1.node.disposer._4_4_ = extraout_var_00;
          PVar1.node.disposer._0_4_ = iVar3;
          PVar1.node.ptr = extraout_RDX_00;
          return (Promise<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_>)PVar1.node;
        }
        local_d8.disposer = (Disposer *)0x0;
        local_c8.exception = (Exception *)0x0;
        uStack_c0 = 0;
        _::Debug::Fault::init
                  ((Fault *)&local_d8,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                  );
        _::Debug::Fault::fatal((Fault *)&local_d8);
      }
      local_a8.ptr.disposer = (Disposer *)0x0;
      local_a8.ptr.ptr = (AsyncCapabilityStream *)0x0;
      OVar7 = heap<kj::_::ImmediatePromiseNode<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>>>,kj::Maybe<kj::Own<kj::AsyncCapabilityStream>>>
                        ((kj *)&local_c8,&local_a8);
      pAVar5 = local_a8.ptr.ptr;
      *(undefined4 *)this = local_c8.exception._0_4_;
      *(undefined4 *)(this + 4) = local_c8.exception._4_4_;
      *(undefined4 *)(this + 8) = (undefined4)uStack_c0;
      *(undefined4 *)(this + 0xc) = uStack_c0._4_4_;
      if (local_a8.ptr.ptr == (AsyncCapabilityStream *)0x0) {
        return (Promise<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_>)OVar7;
      }
      local_a8.ptr.ptr = (AsyncCapabilityStream *)0x0;
      local_b8 = (undefined1  [8])local_a8.ptr.disposer;
      goto LAB_00322ecb;
    }
    iVar3 = _::Debug::getOsErrorNumber(true);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    local_d8.disposer = (Disposer *)0x0;
    local_c8.exception = (Exception *)0x0;
    uStack_c0 = 0;
    _::Debug::Fault::init
              ((Fault *)&local_d8,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
              );
    _::Debug::Fault::fatal((Fault *)&local_d8);
  }
  UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_b8);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)local_b8,
             _::
             TransformPromiseNode<kj::Promise<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++:467:50),_kj::_::PropagateException>
             ::anon_class_8_1_8991fb9c_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0044d0b0;
  this_00[1].super_PromiseNode._vptr_PromiseNode = in_RSI;
  local_d8.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>>>,kj::_::Void,kj::(anonymous_namespace)::AsyncStreamFd::tryReceiveFdImpl<kj::Own<kj::AsyncCapabilityStream>>()::{lambda()#2},kj::_::PropagateException>>
        ::instance;
  local_d8.ptr = (PromiseNode *)this_00;
  OVar6 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_c8,&local_d8);
  pPVar2 = local_d8.ptr;
  *(undefined4 *)this = local_c8.exception._0_4_;
  *(undefined4 *)(this + 4) = local_c8.exception._4_4_;
  *(undefined4 *)(this + 8) = (undefined4)uStack_c0;
  *(undefined4 *)(this + 0xc) = uStack_c0._4_4_;
  if ((TransformPromiseNodeBase *)local_d8.ptr != (TransformPromiseNodeBase *)0x0) {
    local_d8.ptr = (PromiseNode *)0x0;
    iVar3 = (**(local_d8.disposer)->_vptr_Disposer)
                      (local_d8.disposer,
                       ((PromiseNode *)&pPVar2->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                       (long)&((PromiseNode *)&pPVar2->_vptr_PromiseNode)->_vptr_PromiseNode);
    OVar6.disposer._4_4_ = extraout_var;
    OVar6.disposer._0_4_ = iVar3;
    OVar6.ptr = extraout_RDX;
  }
  pAVar5 = local_b0;
  if (local_b0 != (AsyncCapabilityStream *)0x0) {
    local_b0 = (AsyncCapabilityStream *)0x0;
LAB_00322ecb:
    iVar3 = (**(((UnixEventPort *)local_b8)->super_EventPort)._vptr_EventPort)
                      (local_b8,(pAVar5->super_AsyncIoStream).super_AsyncInputStream.
                                _vptr_AsyncInputStream[-2] + (long)&pAVar5->super_AsyncIoStream);
    OVar6.disposer._4_4_ = extraout_var_01;
    OVar6.disposer._0_4_ = iVar3;
    OVar6.ptr = extraout_RDX_01;
  }
  return (PromiseBase)(PromiseBase)OVar6;
}

Assistant:

kj::Promise<kj::Maybe<T>> tryReceiveFdImpl() {
    struct msghdr msg;
    memset(&msg, 0, sizeof(msg));

    struct iovec iov;
    memset(&iov, 0, sizeof(iov));
    char c;
    iov.iov_base = &c;
    iov.iov_len = 1;
    msg.msg_iov = &iov;
    msg.msg_iovlen = 1;

    // Allocate space to receive a cmsg.
    union {
      struct cmsghdr cmsg;
      char cmsgSpace[CMSG_SPACE(sizeof(int))];
    };
    msg.msg_control = &cmsg;
    msg.msg_controllen = sizeof(cmsgSpace);

#ifdef MSG_CMSG_CLOEXEC
    int recvmsgFlags = MSG_CMSG_CLOEXEC;
#else
    int recvmsgFlags = 0;
#endif

    ssize_t n;
    KJ_NONBLOCKING_SYSCALL(n = recvmsg(fd, &msg, recvmsgFlags));
    if (n < 0) {
      return observer.whenBecomesReadable().then([this]() {
        return tryReceiveFdImpl<T>();
      });
    } else if (n == 0) {
      return kj::Maybe<T>(nullptr);
    } else {
      KJ_REQUIRE(msg.msg_controllen >= sizeof(cmsg),
          "expected to receive FD over socket; received data instead");

      // We expect an SCM_RIGHTS message with a single FD.
      KJ_REQUIRE(cmsg.cmsg_level == SOL_SOCKET);
      KJ_REQUIRE(cmsg.cmsg_type == SCM_RIGHTS);
      KJ_REQUIRE(cmsg.cmsg_len == CMSG_LEN(sizeof(int)));

      int receivedFd;
      memcpy(&receivedFd, CMSG_DATA(&cmsg), sizeof(receivedFd));
      return kj::Maybe<T>(wrapFd(receivedFd, (T*)nullptr));
    }
  }